

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

void __thiscall fasttext::Autotune::startTimer(Autotune *this,Args *args)

{
  id iVar1;
  undefined8 uVar2;
  id __tmp;
  __sighandler_t p_Var3;
  _func_void__Any_data_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  pointer *__ptr;
  __sighandler_t previousSignalHandler;
  __sighandler_t local_1d8;
  thread local_1d0;
  Autotune *local_1c8;
  long lStack_1c0;
  Args local_1b8;
  
  lStack_1c0 = std::chrono::_V2::steady_clock::now();
  local_1c8 = this;
  Args::Args(&local_1b8,args);
  local_1d0._M_id._M_thread = (id)0;
  p_Var3 = (__sighandler_t)operator_new(0x1b0);
  *(undefined ***)p_Var3 = &PTR___State_impl_00136628;
  *(Autotune **)(p_Var3 + 8) = local_1c8;
  *(long *)(p_Var3 + 0x10) = lStack_1c0;
  Args::Args((Args *)(p_Var3 + 0x18),&local_1b8);
  local_1d8 = p_Var3;
  std::thread::_M_start_thread(&local_1d0,&local_1d8,0);
  if (local_1d8 != (__sighandler_t)0x0) {
    (**(code **)(*(long *)local_1d8 + 8))();
  }
  iVar1._M_thread = (this->timer_)._M_id._M_thread;
  if (iVar1._M_thread == 0) {
    (this->timer_)._M_id._M_thread = (native_handle_type)local_1d0._M_id._M_thread;
    local_1d0._M_id._M_thread = (id)(id)iVar1._M_thread;
    Args::~Args(&local_1b8);
    this->bestScore_ = -1.0;
    this->trials_ = 0;
    LOCK();
    (this->continueTraining_)._M_base._M_i = true;
    UNLOCK();
    local_1d8 = signal(2,anon_unknown.dwarf_3d22f::signalHandler);
    uVar2 = (anonymous_namespace)::interruptSignalHandler._16_8_;
    local_1c8 = (Autotune *)(anonymous_namespace)::interruptSignalHandler._0_8_;
    lStack_1c0 = (anonymous_namespace)::interruptSignalHandler._8_8_;
    local_1b8.manualArgs_._M_h._M_buckets =
         (__buckets_ptr)(anonymous_namespace)::interruptSignalHandler._16_8_;
    (anonymous_namespace)::interruptSignalHandler._16_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/autotune.cc:283:28)>
         ::_M_manager;
    local_1b8.manualArgs_._M_h._M_bucket_count =
         (anonymous_namespace)::interruptSignalHandler._24_8_;
    (anonymous_namespace)::interruptSignalHandler._24_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/autotune.cc:283:28)>
         ::_M_invoke;
    (anonymous_namespace)::interruptSignalHandler._0_8_ = &local_1d8;
    (anonymous_namespace)::interruptSignalHandler._8_8_ = this;
    if (uVar2 != 0) {
      (anonymous_namespace)::interruptSignalHandler._0_8_ = &local_1d8;
      (*(code *)uVar2)(&local_1c8,&local_1c8,3);
    }
    return;
  }
  std::terminate();
}

Assistant:

void Autotune::startTimer(const Args& args) {
  std::chrono::steady_clock::time_point start =
      std::chrono::steady_clock::now();
  timer_ = std::thread([=]() { timer(start, args.autotuneDuration); });
  bestScore_ = kUnknownBestScore;
  trials_ = 0;
  continueTraining_ = true;

  auto previousSignalHandler = std::signal(SIGINT, signalHandler);
  interruptSignalHandler = [&]() {
    std::signal(SIGINT, previousSignalHandler);
    std::cerr << std::endl << "Aborting autotune..." << std::endl;
    abort();
  };
}